

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O2

uint64_t basisu::pack_eac_a8(pack_eac_a8_results *results,uint8_t *pPixels,uint32_t num_pixels,
                            uint32_t base_search_rad,uint32_t mul_search_rad,uint32_t table_mask)

{
  uint8_vec *this;
  uint8_vec *this_00;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint32_t i;
  ulong uVar11;
  size_t sVar12;
  int base;
  uint uVar13;
  uint uVar14;
  undefined1 *puVar15;
  ulong uVar16;
  int multiplier;
  uint uVar17;
  uint uVar18;
  ulong new_size_size_t;
  uint64_t uVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar25 [12];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  
  auVar25 = in_XMM1._4_12_;
  this = &results->m_selectors;
  new_size_size_t = (ulong)num_pixels;
  vector<unsigned_char>::resize(this,new_size_size_t,false);
  this_00 = &results->m_selectors_temp;
  vector<unsigned_char>::resize(this_00,new_size_size_t,false);
  uVar2 = 0xff;
  uVar5 = 0;
  for (uVar11 = 0; new_size_size_t != uVar11; uVar11 = uVar11 + 1) {
    bVar1 = pPixels[uVar11];
    if (bVar1 <= uVar2) {
      uVar2 = (uint)bVar1;
    }
    if (uVar5 <= bVar1) {
      uVar5 = (uint)bVar1;
    }
  }
  if (uVar5 - uVar2 == 0) {
    results->m_base = uVar5;
    results->m_table = 0xd;
    results->m_multiplier = 1;
    uVar19 = 0;
    for (sVar12 = 0; new_size_size_t != sVar12; sVar12 = sVar12 + 1) {
      puVar4 = vector<unsigned_char>::operator[](this,sVar12);
      *puVar4 = '\x04';
    }
  }
  else {
    auVar23._0_4_ = (float)(uVar5 - uVar2);
    auVar23._4_12_ = auVar25;
    uVar19 = 0xffffffffffffffff;
    puVar15 = &g_etc2_eac_tables;
    auVar24 = auVar23;
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      if ((table_mask >> ((uint)lVar10 & 0x1f) & 1) != 0) {
        fVar20 = (float)((int)(char)(&DAT_00309857)[lVar10 * 8] -
                        (int)(char)(&DAT_00309853)[lVar10 * 8]);
        auVar21._4_12_ = auVar24._4_12_;
        auVar21._0_4_ =
             ((float)-(int)(char)(&DAT_00309853)[lVar10 * 8] / fVar20) *
             ((float)uVar5 - (float)uVar2) + (float)uVar2;
        auVar26._0_8_ = CONCAT44(auVar24._4_4_,auVar21._0_4_) & 0x8000000080000000;
        auVar26._8_4_ = auVar24._8_4_ & 0x80000000;
        auVar26._12_4_ = auVar24._12_4_ & 0x80000000;
        auVar24._4_12_ = SUB1612(auVar26 | _DAT_00264590,4);
        auVar24._0_4_ = SUB164(auVar26 | _DAT_00264590,0) + auVar21._0_4_;
        auVar24 = roundss(auVar21,auVar24,0xb);
        uVar6 = (int)auVar24._0_4_ - base_search_rad;
        uVar13 = (int)~uVar6 >> 0x1f;
        if (uVar6 < 0x100) {
          uVar13 = uVar6;
        }
        uVar13 = uVar13 & 0xff;
        uVar3 = (int)auVar24._0_4_ + base_search_rad;
        uVar6 = (int)~uVar3 >> 0x1f;
        if (uVar3 < 0x100) {
          uVar6 = uVar3;
        }
        fVar20 = auVar23._0_4_ / fVar20;
        auVar24 = ZEXT416((uint)fVar20);
        auVar21 = ZEXT416((uint)fVar20 & 0x80000000) | _DAT_00264590;
        auVar22._4_12_ = auVar21._4_12_;
        auVar22._0_4_ = auVar21._0_4_ + fVar20;
        auVar21 = roundss(auVar22,auVar22,0xb);
        uVar3 = (int)auVar21._0_4_ - mul_search_rad;
        if (0xe < (int)uVar3) {
          uVar3 = 0xf;
        }
        if ((int)uVar3 < 2) {
          uVar3 = 1;
        }
        uVar14 = (int)auVar21._0_4_ + mul_search_rad;
        if (0xe < (int)uVar14) {
          uVar14 = 0xf;
        }
        if ((int)uVar14 < 2) {
          uVar14 = 1;
        }
        for (; uVar17 = uVar3, uVar13 <= (uVar6 & 0xff); uVar13 = uVar13 + 1) {
          for (; uVar17 <= uVar14; uVar17 = uVar17 + 1) {
            sVar12 = 0;
            uVar11 = 0;
            do {
              if (sVar12 == new_size_size_t) break;
              uVar18 = 0xffffffff;
              uVar16 = 0;
              for (uVar7 = 0; uVar7 != 8; uVar7 = uVar7 + 1) {
                uVar8 = (int)(char)puVar15[uVar7] * uVar17 + uVar13;
                uVar9 = (int)~uVar8 >> 0x1f;
                if (uVar8 < 0x100) {
                  uVar9 = uVar8;
                }
                uVar8 = (uint)pPixels[sVar12] - (uVar9 & 0xff);
                uVar9 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar9 = uVar8;
                }
                if (uVar9 < uVar18) {
                  uVar16 = uVar7 & 0xffffffff;
                  uVar18 = uVar9;
                }
              }
              puVar4 = vector<unsigned_char>::operator[](this_00,sVar12);
              *puVar4 = (uchar)uVar16;
              uVar11 = uVar11 + uVar18 * uVar18;
              sVar12 = sVar12 + 1;
            } while (uVar11 < uVar19);
            if (uVar11 < uVar19) {
              results->m_base = uVar13;
              results->m_multiplier = uVar17;
              results->m_table = (uint)lVar10;
              vector<unsigned_char>::swap(this,this_00);
              uVar19 = uVar11;
              if (uVar11 == 0) {
                return 0;
              }
            }
          }
        }
      }
      puVar15 = puVar15 + 8;
    }
  }
  return uVar19;
}

Assistant:

uint64_t pack_eac_a8(pack_eac_a8_results& results, const uint8_t* pPixels, uint32_t num_pixels, uint32_t base_search_rad, uint32_t mul_search_rad, uint32_t table_mask)
	{
		results.m_selectors.resize(num_pixels);
		results.m_selectors_temp.resize(num_pixels);

		uint32_t min_alpha = 255, max_alpha = 0;
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const uint32_t a = pPixels[i];
			if (a < min_alpha) min_alpha = a;
			if (a > max_alpha) max_alpha = a;
		}

		if (min_alpha == max_alpha)
		{
			results.m_base = min_alpha;
			results.m_table = 13;
			results.m_multiplier = 1;
			for (uint32_t i = 0; i < num_pixels; i++)
				results.m_selectors[i] = 4;
			return 0;
		}

		const uint32_t alpha_range = max_alpha - min_alpha;

		uint64_t best_err = UINT64_MAX;

		for (uint32_t table = 0; table < 16; table++)
		{
			if ((table_mask & (1U << table)) == 0)
				continue;

			const float range = (float)(g_etc2_eac_tables[table][ETC2_EAC_MAX_VALUE_SELECTOR] - g_etc2_eac_tables[table][ETC2_EAC_MIN_VALUE_SELECTOR]);
			const int center = (int)roundf(lerp((float)min_alpha, (float)max_alpha, (float)(0 - g_etc2_eac_tables[table][ETC2_EAC_MIN_VALUE_SELECTOR]) / range));

			const int base_min = clamp255(center - base_search_rad);
			const int base_max = clamp255(center + base_search_rad);

			const int mul = (int)roundf(alpha_range / range);
			const int mul_low = clamp<int>(mul - mul_search_rad, 1, 15);
			const int mul_high = clamp<int>(mul + mul_search_rad, 1, 15);

			for (int base = base_min; base <= base_max; base++)
			{
				for (int multiplier = mul_low; multiplier <= mul_high; multiplier++)
				{
					uint64_t total_err = 0;

					for (uint32_t i = 0; i < num_pixels; i++)
					{
						const int a = pPixels[i];

						uint32_t best_s_err = UINT32_MAX;
						uint32_t best_s = 0;
						for (uint32_t s = 0; s < 8; s++)
						{
							const int v = clamp255((int)multiplier * g_etc2_eac_tables[table][s] + (int)base);

							uint32_t err = iabs(a - v);
							if (err < best_s_err)
							{
								best_s_err = err;
								best_s = s;
							}
						}

						results.m_selectors_temp[i] = static_cast<uint8_t>(best_s);

						total_err += best_s_err * best_s_err;
						if (total_err >= best_err)
							break;
					}

					if (total_err < best_err)
					{
						best_err = total_err;
						results.m_base = base;
						results.m_multiplier = multiplier;
						results.m_table = table;
						results.m_selectors.swap(results.m_selectors_temp);
						if (!best_err)
							return best_err;
					}

				} // table

			} // multiplier

		} // base

		return best_err;
	}